

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ctype.c
# Opt level: O0

GCstr * lj_ctype_repr_int64(lua_State *L,uint64_t n,int isunsigned)

{
  undefined1 auVar1 [16];
  char *pcVar2;
  GCstr *pGVar3;
  bool bVar4;
  char *pcStack_40;
  int sign;
  char *p;
  char buf [24];
  ulong uStack_18;
  int isunsigned_local;
  uint64_t n_local;
  lua_State *L_local;
  
  bVar4 = false;
  buf[0xf] = 'L';
  buf[0xe] = 'L';
  uStack_18 = n;
  if (isunsigned == 0) {
    bVar4 = (long)n < 0;
    pcVar2 = buf + 0xe;
    if (bVar4) {
      uStack_18 = -n;
    }
  }
  else {
    buf[0xd] = 'U';
    pcVar2 = buf + 0xd;
  }
  do {
    pcStack_40 = pcVar2;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uStack_18;
    pcStack_40[-1] = SUB161(auVar1 % ZEXT816(10),0) + '0';
    uStack_18 = uStack_18 / 10;
    pcVar2 = pcStack_40 + -1;
  } while (uStack_18 != 0);
  if (bVar4) {
    pcStack_40[-2] = '-';
    pcVar2 = pcStack_40 + -2;
  }
  pcStack_40 = pcVar2;
  buf._20_4_ = isunsigned;
  pGVar3 = lj_str_new(L,pcStack_40,(size_t)(buf + (0x10 - (long)pcStack_40)));
  return pGVar3;
}

Assistant:

GCstr *lj_ctype_repr_int64(lua_State *L, uint64_t n, int isunsigned)
{
  char buf[1+20+3];
  char *p = buf+sizeof(buf);
  int sign = 0;
  *--p = 'L'; *--p = 'L';
  if (isunsigned) {
    *--p = 'U';
  } else if ((int64_t)n < 0) {
    n = (uint64_t)-(int64_t)n;
    sign = 1;
  }
  do { *--p = (char)('0' + n % 10); } while (n /= 10);
  if (sign) *--p = '-';
  return lj_str_new(L, p, (size_t)(buf+sizeof(buf)-p));
}